

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Angle FT_Atan2(FT_Fixed dx,FT_Fixed dy)

{
  undefined1 local_30 [8];
  FT_Vector v;
  FT_Fixed dy_local;
  FT_Fixed dx_local;
  
  if ((dx == 0) && (dy == 0)) {
    dx_local = 0;
  }
  else {
    local_30 = (undefined1  [8])dx;
    v.x = dy;
    v.y = dy;
    ft_trig_prenorm((FT_Vector *)local_30);
    ft_trig_pseudo_polarize((FT_Vector *)local_30);
    dx_local = v.x;
  }
  return dx_local;
}

Assistant:

FT_EXPORT_DEF( FT_Angle )
  FT_Atan2( FT_Fixed  dx,
            FT_Fixed  dy )
  {
    FT_Vector  v;


    if ( dx == 0 && dy == 0 )
      return 0;

    v.x = dx;
    v.y = dy;
    ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    return v.y;
  }